

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O1

void set_get_max_keylen(void)

{
  size_t *psVar1;
  fdb_kvs_handle *handle;
  fdb_status fVar2;
  size_t sVar3;
  size_t sVar4;
  fdb_config *__ptr;
  size_t metalen;
  size_t bodylen;
  fdb_kvs_handle *fconfig_00;
  fdb_config *pfVar5;
  uint uVar6;
  ulong unaff_RBP;
  char *pcVar7;
  fdb_file_info *unaff_R12;
  fdb_file_handle **ptr_fhandle;
  ulong uVar8;
  fdb_kvs_handle *unaff_R13;
  fdb_kvs_handle **unaff_R15;
  char *kvs_config_00;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  size_t rvalue_len;
  void *rvalue;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  fdb_config fconfig;
  char keybuf [65408];
  fdb_doc *pfStack_117a8;
  fdb_kvs_handle *pfStack_117a0;
  fdb_file_handle *pfStack_11798;
  timeval tStack_11790;
  fdb_kvs_config fStack_11780;
  fdb_config fStack_11768;
  char acStack_11670 [256];
  char *pcStack_11570;
  fdb_config *pfStack_11568;
  fdb_config *pfStack_11560;
  fdb_file_handle *pfStack_11550;
  fdb_kvs_handle *pfStack_11548;
  fdb_kvs_config fStack_11540;
  timeval tStack_11528;
  char acStack_11518 [264];
  fdb_config fStack_11410;
  char acStack_11318 [256];
  char acStack_11218 [264];
  char *pcStack_11110;
  fdb_file_handle **ppfStack_11108;
  fdb_kvs_handle *pfStack_11100;
  fdb_config *pfStack_110f8;
  fdb_kvs_config *pfStack_110f0;
  code *pcStack_110e8;
  fdb_kvs_handle *pfStack_110d0;
  fdb_file_handle *pfStack_110c8;
  fdb_iterator *pfStack_110c0;
  timeval tStack_110b8;
  fdb_kvs_config fStack_110a8;
  fdb_file_handle *apfStack_11090 [32];
  fdb_config fStack_10f90;
  fdb_config fStack_10e88;
  char acStack_10d90 [264];
  fdb_config *pfStack_10c88;
  fdb_file_info *pfStack_10c80;
  fdb_kvs_handle *pfStack_10c78;
  fdb_config *pfStack_10c70;
  fdb_kvs_handle **ppfStack_10c68;
  code *pcStack_10c60;
  fdb_file_handle *pfStack_10c50;
  fdb_kvs_handle *pfStack_10c48;
  fdb_doc *pfStack_10c40;
  undefined1 auStack_10c38 [40];
  fdb_seqnum_t fStack_10c10;
  uint64_t uStack_10c08;
  void *pvStack_10c00;
  fdb_config *pfStack_10bf8;
  uint64_t uStack_10bf0;
  fdb_kvs_config fStack_10be8;
  timeval tStack_10bd0;
  undefined1 auStack_10bc0 [72];
  fdb_config fStack_10b78;
  char acStack_10a78 [256];
  fdb_config fStack_10978;
  fdb_config *pfStack_10880;
  fdb_config *pfStack_10878;
  fdb_doc *pfStack_10868;
  fdb_kvs_handle *pfStack_10860;
  fdb_file_handle *pfStack_10858;
  undefined1 auStack_10850 [40];
  fdb_seqnum_t fStack_10828;
  uint64_t uStack_10820;
  void *pvStack_10818;
  fdb_config *pfStack_10810;
  uint64_t uStack_10808;
  fdb_kvs_config fStack_107f8;
  timeval tStack_107e0;
  uint8_t auStack_107d0 [256];
  fdb_config fStack_106d0;
  fdb_config fStack_105d0;
  fdb_config *pfStack_104d8;
  fdb_config *pfStack_104d0;
  fdb_file_handle *pfStack_104c0;
  fdb_kvs_handle *pfStack_104b8;
  size_t sStack_104b0;
  int *piStack_104a8;
  timeval tStack_104a0;
  fdb_config fStack_10490;
  fdb_kvs_handle *pfStack_10398;
  fdb_file_handle *pfStack_10388;
  fdb_kvs_handle *pfStack_10380;
  fdb_kvs_config fStack_10378;
  timeval tStack_10360;
  fdb_config fStack_10350;
  fdb_file_info fStack_10258;
  char acStack_10210 [264];
  fdb_kvs_handle *pfStack_10108;
  fdb_kvs_handle *pfStack_100d8;
  fdb_file_handle *pfStack_100d0;
  size_t sStack_100c8;
  void *pvStack_100c0;
  fdb_kvs_config fStack_100b8;
  timeval tStack_100a0;
  fdb_kvs_handle afStack_10090 [126];
  undefined1 local_19;
  
  gettimeofday(&tStack_100a0,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_kvs_config();
  fconfig_00 = afStack_10090;
  fdb_get_default_config();
  afStack_10090[0].kvs_config.create_if_missing = true;
  afStack_10090[0].kvs_config._1_1_ = 0;
  system("rm -rf  dummy* > errorlog.txt");
  memset(&afStack_10090[0].config.num_bgflusher_threads,0x61,0xff80);
  local_19 = 0;
  fVar2 = fdb_open(&pfStack_100d0,"./dummy1",(fdb_config *)fconfig_00);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fVar2 = fdb_kvs_open_default(pfStack_100d0,&pfStack_100d8,&fStack_100b8);
    handle = pfStack_100d8;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110023;
    psVar1 = &afStack_10090[0].config.num_bgflusher_threads;
    sVar3 = strlen((char *)psVar1);
    fVar2 = fdb_set_kv(handle,psVar1,sVar3,(void *)0x0,0);
    fconfig_00 = handle;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110028;
    fVar2 = fdb_get(pfStack_100d8,(fdb_doc *)0x0);
    if (fVar2 != FDB_RESULT_INVALID_ARGS) goto LAB_0011002d;
    psVar1 = &afStack_10090[0].config.num_bgflusher_threads;
    sVar3 = strlen((char *)psVar1);
    fVar2 = fdb_get_kv(pfStack_100d8,psVar1,sVar3,&pvStack_100c0,&sStack_100c8);
    fconfig_00 = pfStack_100d8;
    if (fVar2 == FDB_RESULT_SUCCESS) {
      fdb_close(pfStack_100d0);
      fdb_shutdown();
      memleak_end();
      pcVar7 = "%s PASSED\n";
      if (set_get_max_keylen()::__test_pass != '\0') {
        pcVar7 = "%s FAILED\n";
      }
      fprintf(_stderr,pcVar7,"set get max keylen");
      return;
    }
  }
  else {
    set_get_max_keylen();
LAB_00110023:
    set_get_max_keylen();
LAB_00110028:
    set_get_max_keylen();
LAB_0011002d:
    set_get_max_keylen();
  }
  pcVar7 = (char *)&afStack_10090[0].config.num_bgflusher_threads;
  set_get_max_keylen();
  pfStack_10398 = (fdb_kvs_handle *)0x110054;
  pfStack_10108 = fconfig_00;
  gettimeofday(&tStack_10360,(__timezone_ptr_t)0x0);
  pfStack_10398 = (fdb_kvs_handle *)0x110059;
  memleak_start();
  pfStack_10398 = (fdb_kvs_handle *)0x110065;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_10398 = (fdb_kvs_handle *)0x11006a;
  sVar4 = fdb_get_buffer_cache_used();
  if (sVar4 == 0) {
    fconfig_00 = (fdb_kvs_handle *)acStack_10210;
    pfStack_10398 = (fdb_kvs_handle *)0x110083;
    fdb_get_default_config();
    pcVar7 = (char *)&fStack_10350;
    pfStack_10398 = (fdb_kvs_handle *)0x110098;
    memcpy(pcVar7,fconfig_00,0xf8);
    fStack_10350.buffercache_size = 0xffffffffffffffff;
    pfStack_10398 = (fdb_kvs_handle *)0x1100b4;
    fVar2 = fdb_open(&pfStack_10388,"./dummy1",(fdb_config *)pcVar7);
    if (fVar2 != FDB_RESULT_TOO_BIG_BUFFER_CACHE) goto LAB_0011030f;
    fconfig_00 = (fdb_kvs_handle *)acStack_10210;
    pfStack_10398 = (fdb_kvs_handle *)0x1100cd;
    fdb_get_default_config();
    pcVar7 = (char *)&fStack_10350;
    pfStack_10398 = (fdb_kvs_handle *)0x1100e2;
    memcpy(pcVar7,fconfig_00,0xf8);
    fStack_10350.max_writer_lock_prob = 0x78;
    pfStack_10398 = (fdb_kvs_handle *)0x1100fe;
    fVar2 = fdb_open(&pfStack_10388,"./dummy1",(fdb_config *)pcVar7);
    if (fVar2 != FDB_RESULT_INVALID_CONFIG) goto LAB_00110314;
    fconfig_00 = (fdb_kvs_handle *)acStack_10210;
    pfStack_10398 = (fdb_kvs_handle *)0x110117;
    fdb_get_default_config();
    pfStack_10398 = (fdb_kvs_handle *)0x110129;
    memcpy(&fStack_10350,fconfig_00,0xf8);
    pfStack_10398 = (fdb_kvs_handle *)0x110133;
    fdb_get_default_kvs_config();
    unaff_RBP = 4;
    pcVar7 = "justonekv";
    unaff_R15 = &pfStack_10380;
    unaff_R12 = &fStack_10258;
    do {
      pfStack_10398 = (fdb_kvs_handle *)0x11015f;
      sprintf((char *)fconfig_00,"dummy%d",unaff_RBP);
      pfStack_10398 = (fdb_kvs_handle *)0x110171;
      fVar2 = fdb_open(&pfStack_10388,(char *)fconfig_00,&fStack_10350);
      if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_001102fb:
        pfStack_10398 = (fdb_kvs_handle *)0x110300;
        config_test();
LAB_00110300:
        pfStack_10398 = (fdb_kvs_handle *)0x110305;
        config_test();
LAB_00110305:
        pfStack_10398 = (fdb_kvs_handle *)0x11030a;
        config_test();
        goto LAB_0011030a;
      }
      pfStack_10398 = (fdb_kvs_handle *)0x11018e;
      fVar2 = fdb_kvs_open(pfStack_10388,unaff_R15,"justonekv",&fStack_10378);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pfStack_10398 = (fdb_kvs_handle *)0x1102fb;
        config_test();
        goto LAB_001102fb;
      }
      pfStack_10398 = (fdb_kvs_handle *)0x11019b;
      unaff_R13 = (fdb_kvs_handle *)fdb_get_buffer_cache_used();
      pfStack_10398 = (fdb_kvs_handle *)0x1101ab;
      fVar2 = fdb_get_file_info(pfStack_10388,unaff_R12);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110305;
      if (fStack_10258.file_size != fStack_10350.blocksize * 7) {
        pfStack_10398 = (fdb_kvs_handle *)0x110203;
        config_test();
      }
      if (unaff_R13 != (fdb_kvs_handle *)(ulong)(fStack_10350.blocksize * 2)) {
        pfStack_10398 = (fdb_kvs_handle *)0x110212;
        config_test();
      }
      pfStack_10398 = (fdb_kvs_handle *)0x1101df;
      fVar2 = fdb_close(pfStack_10388);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110300;
      uVar6 = (int)unaff_RBP - 1;
      unaff_RBP = (ulong)uVar6;
    } while (uVar6 != 0);
    pfStack_10398 = (fdb_kvs_handle *)0x11022b;
    fVar2 = fdb_open(&pfStack_10388,acStack_10210,&fStack_10350);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110319;
    pfStack_10398 = (fdb_kvs_handle *)0x11024e;
    fVar2 = fdb_kvs_open(pfStack_10388,&pfStack_10380,"justonekv",&fStack_10378);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011031e;
    pfStack_10398 = (fdb_kvs_handle *)0x110279;
    fVar2 = fdb_set_kv(pfStack_10380,"key",3,"body",5);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_10398 = (fdb_kvs_handle *)0x110286;
      sVar4 = fdb_get_buffer_cache_used();
      if (sVar4 != fStack_10350.blocksize << 3) {
        pfStack_10398 = (fdb_kvs_handle *)0x11029f;
        config_test();
      }
      pfStack_10398 = (fdb_kvs_handle *)0x1102a9;
      fdb_close(pfStack_10388);
      pfStack_10398 = (fdb_kvs_handle *)0x1102ae;
      fdb_shutdown();
      pfStack_10398 = (fdb_kvs_handle *)0x1102b3;
      memleak_end();
      pcVar7 = "%s PASSED\n";
      if (config_test()::__test_pass != '\0') {
        pcVar7 = "%s FAILED\n";
      }
      pfStack_10398 = (fdb_kvs_handle *)0x1102e4;
      fprintf(_stderr,pcVar7,"forestdb config test");
      return;
    }
  }
  else {
LAB_0011030a:
    pfStack_10398 = (fdb_kvs_handle *)0x11030f;
    config_test();
LAB_0011030f:
    pfStack_10398 = (fdb_kvs_handle *)0x110314;
    config_test();
LAB_00110314:
    pfStack_10398 = (fdb_kvs_handle *)0x110319;
    config_test();
LAB_00110319:
    pfStack_10398 = (fdb_kvs_handle *)0x11031e;
    config_test();
LAB_0011031e:
    pfStack_10398 = (fdb_kvs_handle *)0x110323;
    config_test();
  }
  pfStack_10398 = (fdb_kvs_handle *)delete_reopen_test;
  config_test();
  pfStack_104d0 = (fdb_config *)0x11033c;
  pfStack_10398 = fconfig_00;
  gettimeofday(&tStack_104a0,(__timezone_ptr_t)0x0);
  pfStack_104d0 = (fdb_config *)0x110341;
  memleak_start();
  pfStack_104d0 = (fdb_config *)0x11034d;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_104d0 = (fdb_config *)0x11035a;
  fdb_get_default_config();
  fStack_10490.buffercache_size = 0;
  fStack_10490.num_compactor_threads = 1;
  pfStack_104d0 = (fdb_config *)0x11037e;
  fVar2 = fdb_open(&pfStack_104c0,"./dummy3",&fStack_10490);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pfStack_104d0 = (fdb_config *)0x110397;
    fVar2 = fdb_kvs_open_default(pfStack_104c0,&pfStack_104b8,(fdb_kvs_config *)0x0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011058e;
    pfStack_104d0 = (fdb_config *)0x1103ae;
    fVar2 = fdb_begin_transaction(pfStack_104c0,'\x02');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110593;
    pfStack_104d0 = (fdb_config *)0x1103d9;
    fVar2 = fdb_set_kv(pfStack_104b8,"foo",3,"value",5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110598;
    pfStack_104d0 = (fdb_config *)0x1103ed;
    fVar2 = fdb_end_transaction(pfStack_104c0,'\0');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011059d;
    pfStack_104d0 = (fdb_config *)0x110415;
    fVar2 = fdb_get_kv(pfStack_104b8,"foo",3,&piStack_104a8,&sStack_104b0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001105a2;
    if (sStack_104b0 != 5) {
      pfStack_104d0 = (fdb_config *)0x11042f;
      delete_reopen_test();
    }
    if ((char)piStack_104a8[1] != 'e' || *piStack_104a8 != 0x756c6176) goto LAB_001105a7;
    pfStack_104d0 = (fdb_config *)0x11044f;
    fdb_free_block(piStack_104a8);
    pfStack_104d0 = (fdb_config *)0x11045e;
    fVar2 = fdb_begin_transaction(pfStack_104c0,'\x02');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001105ac;
    pfStack_104d0 = (fdb_config *)0x11047c;
    fVar2 = fdb_del_kv(pfStack_104b8,"foo",3);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001105b1;
    pfStack_104d0 = (fdb_config *)0x110490;
    fVar2 = fdb_end_transaction(pfStack_104c0,'\0');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001105b6;
    pfStack_104d0 = (fdb_config *)0x1104b8;
    fVar2 = fdb_get_kv(pfStack_104b8,"foo",3,&piStack_104a8,&sStack_104b0);
    if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001105bb;
    pfStack_104d0 = (fdb_config *)0x1104cb;
    fVar2 = fdb_close(pfStack_104c0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001105c0;
    pfStack_104d0 = (fdb_config *)0x1104e9;
    fVar2 = fdb_open(&pfStack_104c0,"./dummy3",&fStack_10490);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001105c5;
    pfStack_104d0 = (fdb_config *)0x110502;
    fVar2 = fdb_kvs_open_default(pfStack_104c0,&pfStack_104b8,(fdb_kvs_config *)0x0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001105ca;
    pfStack_104d0 = (fdb_config *)0x11052a;
    fVar2 = fdb_get_kv(pfStack_104b8,"foo",3,&piStack_104a8,&sStack_104b0);
    if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001105cf;
    pfStack_104d0 = (fdb_config *)0x11053d;
    fVar2 = fdb_close(pfStack_104c0);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_104d0 = (fdb_config *)0x11054a;
      fdb_shutdown();
      pfStack_104d0 = (fdb_config *)0x11054f;
      memleak_end();
      pcVar7 = "%s PASSED\n";
      if (delete_reopen_test()::__test_pass != '\0') {
        pcVar7 = "%s FAILED\n";
      }
      pfStack_104d0 = (fdb_config *)0x110580;
      fprintf(_stderr,pcVar7,"end trans delete & reopen passed");
      return;
    }
  }
  else {
    pfStack_104d0 = (fdb_config *)0x11058e;
    delete_reopen_test();
LAB_0011058e:
    pfStack_104d0 = (fdb_config *)0x110593;
    delete_reopen_test();
LAB_00110593:
    pfStack_104d0 = (fdb_config *)0x110598;
    delete_reopen_test();
LAB_00110598:
    pfStack_104d0 = (fdb_config *)0x11059d;
    delete_reopen_test();
LAB_0011059d:
    pfStack_104d0 = (fdb_config *)0x1105a2;
    delete_reopen_test();
LAB_001105a2:
    pfStack_104d0 = (fdb_config *)0x1105a7;
    delete_reopen_test();
LAB_001105a7:
    pfStack_104d0 = (fdb_config *)0x1105ac;
    delete_reopen_test();
LAB_001105ac:
    pfStack_104d0 = (fdb_config *)0x1105b1;
    delete_reopen_test();
LAB_001105b1:
    pfStack_104d0 = (fdb_config *)0x1105b6;
    delete_reopen_test();
LAB_001105b6:
    pfStack_104d0 = (fdb_config *)0x1105bb;
    delete_reopen_test();
LAB_001105bb:
    pfStack_104d0 = (fdb_config *)0x1105c0;
    delete_reopen_test();
LAB_001105c0:
    pfStack_104d0 = (fdb_config *)0x1105c5;
    delete_reopen_test();
LAB_001105c5:
    pfStack_104d0 = (fdb_config *)0x1105ca;
    delete_reopen_test();
LAB_001105ca:
    pfStack_104d0 = (fdb_config *)0x1105cf;
    delete_reopen_test();
LAB_001105cf:
    pfStack_104d0 = (fdb_config *)0x1105d4;
    delete_reopen_test();
  }
  pfStack_104d0 = (fdb_config *)deleted_doc_get_api_test;
  delete_reopen_test();
  pfStack_10878 = (fdb_config *)0x1105f2;
  pfStack_104d8 = &fStack_10490;
  pfStack_104d0 = (fdb_config *)pcVar7;
  gettimeofday(&tStack_107e0,(__timezone_ptr_t)0x0);
  pfStack_10878 = (fdb_config *)0x1105f7;
  memleak_start();
  pfStack_10878 = (fdb_config *)0x110603;
  system("rm -rf  dummy* > errorlog.txt");
  uStack_10808 = 0;
  auStack_10850._0_8_ = 0;
  auStack_10850._8_8_ = 0;
  auStack_10850._16_8_ = 0;
  auStack_10850._24_8_ = 0;
  uStack_10820 = 0;
  pvStack_10818 = (void *)0x0;
  auStack_10850._32_8_ = auStack_107d0;
  pfStack_10810 = &fStack_106d0;
  fStack_10828 = 0xffffffffffffffff;
  pfVar5 = &fStack_105d0;
  pfStack_10878 = (fdb_config *)0x110652;
  fdb_get_default_config();
  fStack_105d0.purging_interval = 1;
  fStack_105d0.seqtree_opt = '\x01';
  pfStack_10878 = (fdb_config *)0x110667;
  fdb_get_default_kvs_config();
  pfStack_10878 = (fdb_config *)0x11067b;
  fVar2 = fdb_open(&pfStack_10858,"./dummy1",pfVar5);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pfStack_10878 = (fdb_config *)0x110699;
    fVar2 = fdb_kvs_open(pfStack_10858,&pfStack_10860,(char *)0x0,&fStack_107f8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108c4;
    builtin_memcpy(auStack_107d0,"key",4);
    pfVar5 = &fStack_106d0;
    fStack_106d0.chunksize = 0x6f62;
    fStack_106d0._2_2_ = 0x7964;
    fStack_106d0.blocksize._0_1_ = 0;
    pfStack_10878 = (fdb_config *)0x1106c6;
    auStack_10850._0_8_ = strlen((char *)auStack_107d0);
    pcVar7 = auStack_10850;
    pfStack_10878 = (fdb_config *)0x1106d6;
    auStack_10850._16_8_ = strlen((char *)pfVar5);
    pfStack_10878 = (fdb_config *)0x1106e7;
    fVar2 = fdb_set(pfStack_10860,(fdb_doc *)pcVar7);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108c9;
    pfStack_10878 = (fdb_config *)0x1106fe;
    fVar2 = fdb_commit(pfStack_10858,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108ce;
    pfStack_10878 = (fdb_config *)0x110715;
    fVar2 = fdb_del(pfStack_10860,(fdb_doc *)auStack_10850);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108d3;
    pfStack_10878 = (fdb_config *)0x11072c;
    fVar2 = fdb_commit(pfStack_10858,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108d8;
    pfVar5 = (fdb_config *)&pfStack_10868;
    pfStack_10878 = (fdb_config *)0x11075e;
    fdb_doc_create((fdb_doc **)pfVar5,auStack_107d0,auStack_10850._0_8_,(void *)0x0,0,(void *)0x0,0)
    ;
    pfStack_10878 = (fdb_config *)0x11076b;
    fVar2 = fdb_get_metaonly(pfStack_10860,pfStack_10868);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108dd;
    if (pfStack_10868->deleted == false) {
      pfStack_10878 = (fdb_config *)0x110788;
      deleted_doc_get_api_test();
    }
    pfStack_10868->deleted = false;
    pfStack_10878 = (fdb_config *)0x11079b;
    fVar2 = fdb_get_metaonly_byseq(pfStack_10860,pfStack_10868);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108e2;
    if (pfStack_10868->deleted == false) {
      pfStack_10878 = (fdb_config *)0x1107b8;
      deleted_doc_get_api_test();
    }
    pfStack_10868->deleted = false;
    pfStack_10878 = (fdb_config *)0x1107cb;
    fVar2 = fdb_get_byoffset(pfStack_10860,pfStack_10868);
    if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001108e7;
    if (pfStack_10868->deleted == false) {
      pfStack_10878 = (fdb_config *)0x1107e9;
      deleted_doc_get_api_test();
    }
    pfStack_10868->deleted = false;
    pfStack_10878 = (fdb_config *)0x1107fc;
    fVar2 = fdb_get(pfStack_10860,pfStack_10868);
    if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001108ec;
    if (pfStack_10868->deleted == true) {
      pfStack_10878 = (fdb_config *)0x11081a;
      deleted_doc_get_api_test();
    }
    pfStack_10868->deleted = false;
    pfStack_10878 = (fdb_config *)0x11082d;
    fVar2 = fdb_get_byseq(pfStack_10860,pfStack_10868);
    if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001108f1;
    if (pfStack_10868->deleted == true) {
      pfStack_10878 = (fdb_config *)0x11084b;
      deleted_doc_get_api_test();
    }
    pfStack_10878 = (fdb_config *)0x110855;
    fdb_doc_free(pfStack_10868);
    pfStack_10878 = (fdb_config *)0x11085f;
    fVar2 = fdb_kvs_close(pfStack_10860);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108f6;
    pfStack_10878 = (fdb_config *)0x110871;
    fVar2 = fdb_close(pfStack_10858);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_10878 = (fdb_config *)0x11087e;
      fdb_shutdown();
      pfStack_10878 = (fdb_config *)0x110883;
      memleak_end();
      pcVar7 = "%s PASSED\n";
      if (deleted_doc_get_api_test()::__test_pass != '\0') {
        pcVar7 = "%s FAILED\n";
      }
      pfStack_10878 = (fdb_config *)0x1108b4;
      fprintf(_stderr,pcVar7,"deleted doc get api test");
      return;
    }
  }
  else {
    pfStack_10878 = (fdb_config *)0x1108c4;
    deleted_doc_get_api_test();
LAB_001108c4:
    pfStack_10878 = (fdb_config *)0x1108c9;
    deleted_doc_get_api_test();
LAB_001108c9:
    pfStack_10878 = (fdb_config *)0x1108ce;
    deleted_doc_get_api_test();
LAB_001108ce:
    pfStack_10878 = (fdb_config *)0x1108d3;
    deleted_doc_get_api_test();
LAB_001108d3:
    pfStack_10878 = (fdb_config *)0x1108d8;
    deleted_doc_get_api_test();
LAB_001108d8:
    pfStack_10878 = (fdb_config *)0x1108dd;
    deleted_doc_get_api_test();
LAB_001108dd:
    pfStack_10878 = (fdb_config *)0x1108e2;
    deleted_doc_get_api_test();
LAB_001108e2:
    pfStack_10878 = (fdb_config *)0x1108e7;
    deleted_doc_get_api_test();
LAB_001108e7:
    pfStack_10878 = (fdb_config *)0x1108ec;
    deleted_doc_get_api_test();
LAB_001108ec:
    pfStack_10878 = (fdb_config *)0x1108f1;
    deleted_doc_get_api_test();
LAB_001108f1:
    pfStack_10878 = (fdb_config *)0x1108f6;
    deleted_doc_get_api_test();
LAB_001108f6:
    pfStack_10878 = (fdb_config *)0x1108fb;
    deleted_doc_get_api_test();
  }
  pfStack_10878 = (fdb_config *)deleted_doc_stat_test;
  deleted_doc_get_api_test();
  pcStack_10c60 = (code *)0x110919;
  pfStack_10880 = pfVar5;
  pfStack_10878 = (fdb_config *)pcVar7;
  gettimeofday(&tStack_10bd0,(__timezone_ptr_t)0x0);
  pcStack_10c60 = (code *)0x11091e;
  memleak_start();
  pcStack_10c60 = (code *)0x11092a;
  system("rm -rf  dummy* > errorlog.txt");
  uStack_10bf0 = 0;
  auStack_10c38._0_8_ = 0;
  auStack_10c38._8_8_ = 0;
  auStack_10c38._16_8_ = 0;
  auStack_10c38._24_8_ = 0;
  uStack_10c08 = 0;
  pvStack_10c00 = (void *)0x0;
  auStack_10c38._32_8_ = acStack_10a78;
  pfStack_10bf8 = &fStack_10b78;
  fStack_10c10 = 0xffffffffffffffff;
  pfVar5 = &fStack_10978;
  pcStack_10c60 = (code *)0x110979;
  fdb_get_default_config();
  fStack_10978.purging_interval = 0;
  pcStack_10c60 = (code *)0x11098a;
  fdb_get_default_kvs_config();
  pcStack_10c60 = (code *)0x11099e;
  fVar2 = fdb_open(&pfStack_10c50,"./dummy1",pfVar5);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_10c60 = (code *)0x1109c1;
    fVar2 = fdb_kvs_open(pfStack_10c50,&pfStack_10c48,"main",&fStack_10be8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110b41;
    acStack_10a78[0] = 'K';
    acStack_10a78[1] = '\0';
    pfVar5 = &fStack_10b78;
    fStack_10b78.chunksize = 0x6f62;
    fStack_10b78._2_2_ = 0x7964;
    fStack_10b78.blocksize._0_1_ = 0;
    pcStack_10c60 = (code *)0x1109ed;
    sVar3 = strlen(acStack_10a78);
    auStack_10c38._0_8_ = sVar3 + 1;
    pcVar7 = auStack_10c38;
    pcStack_10c60 = (code *)0x110a00;
    sVar3 = strlen((char *)pfVar5);
    auStack_10c38._16_8_ = sVar3 + 1;
    pcStack_10c60 = (code *)0x110a14;
    fVar2 = fdb_set(pfStack_10c48,(fdb_doc *)pcVar7);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110b46;
    pcStack_10c60 = (code *)0x110a2b;
    fVar2 = fdb_del(pfStack_10c48,(fdb_doc *)auStack_10c38);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110b4b;
    pfVar5 = (fdb_config *)&pfStack_10c40;
    pcStack_10c60 = (code *)0x110a5a;
    fdb_doc_create((fdb_doc **)pfVar5,(void *)auStack_10c38._32_8_,auStack_10c38._0_8_,(void *)0x0,0
                   ,(void *)0x0,0);
    pcStack_10c60 = (code *)0x110a67;
    fVar2 = fdb_get(pfStack_10c48,pfStack_10c40);
    if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_00110b50;
    pcStack_10c60 = (code *)0x110a7a;
    fdb_doc_free(pfStack_10c40);
    pcStack_10c60 = (code *)0x110a8c;
    fdb_get_file_info(pfStack_10c50,(fdb_file_info *)auStack_10bc0);
    pfVar5 = (fdb_config *)(auStack_10bc0 + 0x10);
    if (auStack_10bc0._16_8_ != 0) {
      pcStack_10c60 = (code *)0x110aa2;
      deleted_doc_stat_test();
    }
    pcStack_10c60 = (code *)0x110aae;
    fVar2 = fdb_commit(pfStack_10c50,'\0');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110b55;
    pcVar7 = auStack_10bc0;
    pcStack_10c60 = (code *)0x110acb;
    fdb_get_file_info(pfStack_10c50,(fdb_file_info *)pcVar7);
    if (auStack_10bc0._16_8_ != 0) {
      pcStack_10c60 = (code *)0x110ada;
      deleted_doc_stat_test();
    }
    pcStack_10c60 = (code *)0x110ae4;
    fVar2 = fdb_kvs_close(pfStack_10c48);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110b5a;
    pcStack_10c60 = (code *)0x110af2;
    fVar2 = fdb_close(pfStack_10c50);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStack_10c60 = (code *)0x110afb;
      fdb_shutdown();
      pcStack_10c60 = (code *)0x110b00;
      memleak_end();
      pcVar7 = "%s PASSED\n";
      if (deleted_doc_stat_test()::__test_pass != '\0') {
        pcVar7 = "%s FAILED\n";
      }
      pcStack_10c60 = (code *)0x110b31;
      fprintf(_stderr,pcVar7,"deleted doc stat test");
      return;
    }
  }
  else {
    pcStack_10c60 = (code *)0x110b41;
    deleted_doc_stat_test();
LAB_00110b41:
    pcStack_10c60 = (code *)0x110b46;
    deleted_doc_stat_test();
LAB_00110b46:
    pcStack_10c60 = (code *)0x110b4b;
    deleted_doc_stat_test();
LAB_00110b4b:
    pcStack_10c60 = (code *)0x110b50;
    deleted_doc_stat_test();
LAB_00110b50:
    pcStack_10c60 = (code *)0x110b55;
    deleted_doc_stat_test();
LAB_00110b55:
    pcStack_10c60 = (code *)0x110b5a;
    deleted_doc_stat_test();
LAB_00110b5a:
    pcStack_10c60 = (code *)0x110b5f;
    deleted_doc_stat_test();
  }
  pcStack_10c60 = complete_delete_test;
  deleted_doc_stat_test();
  pcStack_110e8 = (code *)0x110b81;
  pfStack_10c88 = pfVar5;
  pfStack_10c80 = unaff_R12;
  pfStack_10c78 = unaff_R13;
  pfStack_10c70 = (fdb_config *)pcVar7;
  ppfStack_10c68 = unaff_R15;
  pcStack_10c60 = (code *)unaff_RBP;
  gettimeofday(&tStack_110b8,(__timezone_ptr_t)0x0);
  pcStack_110e8 = (code *)0x110b86;
  memleak_start();
  pcVar7 = acStack_10d90;
  builtin_strncpy(acStack_10d90,"./dummy1",9);
  pcStack_110e8 = (code *)0x110bab;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar5 = &fStack_10e88;
  pcStack_110e8 = (code *)0x110bbb;
  fdb_get_default_config();
  fStack_10e88.buffercache_size = 0;
  kvs_config_00 = &fStack_110a8.create_if_missing;
  pcStack_110e8 = (code *)0x110bd0;
  fdb_get_default_kvs_config();
  ptr_fhandle = &pfStack_110c8;
  pcStack_110e8 = (code *)0x110be3;
  fdb_open(ptr_fhandle,pcVar7,pfVar5);
  pcStack_110e8 = (code *)0x110bfb;
  fVar2 = fdb_kvs_open(pfStack_110c8,&pfStack_110d0,"db1",(fdb_kvs_config *)kvs_config_00);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110d95;
  unaff_RBP = 0;
  do {
    pcStack_110e8 = (code *)0x110c2c;
    sprintf((char *)&fStack_10f90,"key%05d",unaff_RBP);
    pcStack_110e8 = (code *)0x110c3b;
    sprintf((char *)apfStack_11090,"value%05d",unaff_RBP);
    unaff_R13 = pfStack_110d0;
    pcStack_110e8 = (code *)0x110c48;
    sVar3 = strlen((char *)&fStack_10f90);
    pcVar7 = (char *)(sVar3 + 1);
    pcStack_110e8 = (code *)0x110c54;
    sVar3 = strlen((char *)apfStack_11090);
    pcStack_110e8 = (code *)0x110c69;
    fVar2 = fdb_set_kv(unaff_R13,&fStack_10f90,(size_t)pcVar7,apfStack_11090,sVar3 + 1);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcStack_110e8 = (code *)0x110d90;
      complete_delete_test();
      goto LAB_00110d90;
    }
    uVar6 = (int)unaff_RBP + 1;
    unaff_RBP = (ulong)uVar6;
  } while (uVar6 != 1000);
  pcStack_110e8 = (code *)0x110c8a;
  fdb_commit(pfStack_110c8,'\x01');
  pcVar7 = "key%05d";
  pfVar5 = &fStack_10f90;
  kvs_config_00 = "value%05d";
  ptr_fhandle = apfStack_11090;
  unaff_RBP = 0;
  do {
    pcStack_110e8 = (code *)0x110cb6;
    sprintf((char *)pfVar5,"key%05d",unaff_RBP);
    pcStack_110e8 = (code *)0x110cc5;
    sprintf((char *)ptr_fhandle,"value%05d",unaff_RBP);
    unaff_R13 = pfStack_110d0;
    pcStack_110e8 = (code *)0x110cd2;
    sVar3 = strlen((char *)pfVar5);
    pcStack_110e8 = (code *)0x110ce1;
    fVar2 = fdb_del_kv(unaff_R13,pfVar5,sVar3 + 1);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110d90;
    uVar6 = (int)unaff_RBP + 1;
    unaff_RBP = (ulong)uVar6;
  } while (uVar6 != 1000);
  pcStack_110e8 = (code *)0x110d02;
  fdb_commit(pfStack_110c8,'\x01');
  pcStack_110e8 = (code *)0x110d22;
  fVar2 = fdb_iterator_init(pfStack_110d0,&pfStack_110c0,(void *)0x0,0,(void *)0x0,0,2);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110d9a;
  pcStack_110e8 = (code *)0x110d30;
  fVar2 = fdb_iterator_close(pfStack_110c0);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_110e8 = (code *)0x110d3e;
    fdb_close(pfStack_110c8);
    pcStack_110e8 = (code *)0x110d43;
    fdb_shutdown();
    pcStack_110e8 = (code *)0x110d48;
    memleak_end();
    pcVar7 = "%s PASSED\n";
    if (complete_delete_test()::__test_pass != '\0') {
      pcVar7 = "%s FAILED\n";
    }
    pcStack_110e8 = (code *)0x110d79;
    fprintf(_stderr,pcVar7,"complete delete");
    return;
  }
  goto LAB_00110d9f;
LAB_00110d90:
  pfVar5 = &fStack_10f90;
  ptr_fhandle = apfStack_11090;
  kvs_config_00 = "value%05d";
  pcStack_110e8 = (code *)0x110d95;
  complete_delete_test();
LAB_00110d95:
  pcStack_110e8 = (code *)0x110d9a;
  complete_delete_test();
LAB_00110d9a:
  pcStack_110e8 = (code *)0x110d9f;
  complete_delete_test();
LAB_00110d9f:
  pcStack_110e8 = large_batch_write_no_commit_test;
  complete_delete_test();
  pfStack_11560 = (fdb_config *)0x110dc1;
  pcStack_11110 = pcVar7;
  ppfStack_11108 = ptr_fhandle;
  pfStack_11100 = unaff_R13;
  pfStack_110f8 = pfVar5;
  pfStack_110f0 = (fdb_kvs_config *)kvs_config_00;
  pcStack_110e8 = (code *)unaff_RBP;
  gettimeofday(&tStack_11528,(__timezone_ptr_t)0x0);
  pfStack_11560 = (fdb_config *)0x110dc6;
  memleak_start();
  pfStack_11560 = (fdb_config *)0x110dd0;
  __ptr = (fdb_config *)malloc(4000000);
  pfStack_11560 = (fdb_config *)0x110ddf;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar5 = &fStack_11410;
  pfStack_11560 = (fdb_config *)0x110def;
  fdb_get_default_config();
  pfStack_11560 = (fdb_config *)0x110df9;
  fdb_get_default_kvs_config();
  pfStack_11560 = (fdb_config *)0x110e0d;
  fVar2 = fdb_open(&pfStack_11550,"./dummy1",pfVar5);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pfStack_11560 = (fdb_config *)0x110e2b;
    fVar2 = fdb_kvs_open(pfStack_11550,&pfStack_11548,(char *)0x0,&fStack_11540);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110fb0;
    pcVar7 = (char *)0x0;
    uVar8 = 0;
    do {
      pfStack_11560 = (fdb_config *)0x110e54;
      sprintf(acStack_11218,"key%128d",uVar8 & 0xffffffff);
      pfStack_11560 = (fdb_config *)0x110e70;
      sprintf(acStack_11318,"meta%128d",uVar8 & 0xffffffff);
      pfStack_11560 = (fdb_config *)0x110e86;
      sprintf(acStack_11518,"body%128d",uVar8 & 0xffffffff);
      pfStack_11560 = (fdb_config *)0x110e92;
      sVar3 = strlen(acStack_11218);
      pfStack_11560 = (fdb_config *)0x110ea0;
      metalen = strlen(acStack_11318);
      pfStack_11560 = (fdb_config *)0x110ead;
      bodylen = strlen(acStack_11518);
      pfStack_11560 = (fdb_config *)0x110ed7;
      fdb_doc_create((fdb_doc **)(pcVar7 + (long)&__ptr->chunksize),acStack_11218,sVar3,
                     acStack_11318,metalen,acStack_11518,bodylen);
      pfStack_11560 = (fdb_config *)0x110ee5;
      fdb_set(pfStack_11548,*(fdb_doc **)(&__ptr->chunksize + uVar8 * 4));
      pfStack_11560 = (fdb_config *)0x110eee;
      fdb_doc_free(*(fdb_doc **)(&__ptr->chunksize + uVar8 * 4));
      uVar8 = uVar8 + 1;
      pcVar7 = pcVar7 + 8;
    } while (uVar8 != 500000);
    pfStack_11560 = (fdb_config *)0x110f0c;
    fVar2 = fdb_kvs_close(pfStack_11548);
    pfVar5 = __ptr;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110fb5;
    pfStack_11560 = (fdb_config *)0x110f1e;
    fVar2 = fdb_close(pfStack_11550);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110fba;
    pfStack_11560 = (fdb_config *)0x110f3f;
    fVar2 = fdb_open(&pfStack_11550,"./dummy1",&fStack_11410);
    if (fVar2 == FDB_RESULT_NO_DB_HEADERS) {
LAB_00110f56:
      pfStack_11560 = (fdb_config *)0x110f5e;
      free(__ptr);
      pfStack_11560 = (fdb_config *)0x110f63;
      fdb_shutdown();
      pfStack_11560 = (fdb_config *)0x110f68;
      memleak_end();
      pcVar7 = "%s PASSED\n";
      if (large_batch_write_no_commit_test()::__test_pass != '\0') {
        pcVar7 = "%s FAILED\n";
      }
      pfStack_11560 = (fdb_config *)0x110f99;
      fprintf(_stderr,pcVar7,"large batch write test with no commits");
      return;
    }
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_11560 = (fdb_config *)0x110f52;
      fVar2 = fdb_close(pfStack_11550);
      if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_00110f56;
      goto LAB_00110fc4;
    }
  }
  else {
    pfStack_11560 = (fdb_config *)0x110fb0;
    large_batch_write_no_commit_test();
LAB_00110fb0:
    pfStack_11560 = (fdb_config *)0x110fb5;
    large_batch_write_no_commit_test();
LAB_00110fb5:
    pfStack_11560 = (fdb_config *)0x110fba;
    large_batch_write_no_commit_test();
LAB_00110fba:
    pfStack_11560 = (fdb_config *)0x110fbf;
    large_batch_write_no_commit_test();
  }
  pfStack_11560 = (fdb_config *)0x110fc4;
  large_batch_write_no_commit_test();
LAB_00110fc4:
  pfStack_11560 = (fdb_config *)set_get_meta_test;
  large_batch_write_no_commit_test();
  pcStack_11570 = pcVar7;
  pfStack_11568 = pfVar5;
  pfStack_11560 = __ptr;
  gettimeofday(&tStack_11790,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fStack_11768.wal_threshold = 0x400;
  fStack_11768.seqtree_opt = '\x01';
  fStack_11768.purging_interval = 1;
  fStack_11768.flags = 1;
  system("rm -rf  dummy* > errorlog.txt");
  fdb_open(&pfStack_11798,"./dummy1",&fStack_11768);
  fdb_kvs_open(pfStack_11798,&pfStack_117a0,"db1",&fStack_11780);
  sprintf(acStack_11670,"key%d",0);
  sVar3 = strlen(acStack_11670);
  fdb_doc_create(&pfStack_117a8,acStack_11670,sVar3,(void *)0x0,0,(void *)0x0,0);
  fdb_set(pfStack_117a0,pfStack_117a8);
  fVar2 = fdb_get(pfStack_117a0,pfStack_117a8);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x345,"void set_get_meta_test()");
  }
  fVar2 = fdb_get_byoffset(pfStack_117a0,pfStack_117a8);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fVar2 = fdb_get_metaonly(pfStack_117a0,pfStack_117a8);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      fVar2 = fdb_get_metaonly_byseq(pfStack_117a0,pfStack_117a8);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        fdb_del(pfStack_117a0,pfStack_117a8);
        fVar2 = fdb_get(pfStack_117a0,pfStack_117a8);
        if (fVar2 == FDB_RESULT_KEY_NOT_FOUND) {
          if (pfStack_117a8->deleted == false) {
            __assert_fail("rdoc->deleted == true",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0x350,"void set_get_meta_test()");
          }
          fVar2 = fdb_get_metaonly(pfStack_117a0,pfStack_117a8);
          if (fVar2 == FDB_RESULT_SUCCESS) {
            if (pfStack_117a8->deleted == false) {
              __assert_fail("rdoc->deleted == true",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                            ,0x354,"void set_get_meta_test()");
            }
            fVar2 = fdb_get_metaonly_byseq(pfStack_117a0,pfStack_117a8);
            if (fVar2 == FDB_RESULT_SUCCESS) {
              if (pfStack_117a8->deleted != false) {
                fVar2 = fdb_get_byoffset(pfStack_117a0,pfStack_117a8);
                if (fVar2 == FDB_RESULT_KEY_NOT_FOUND) {
                  if (pfStack_117a8->deleted != false) {
                    fdb_doc_free(pfStack_117a8);
                    fdb_kvs_close(pfStack_117a0);
                    fdb_close(pfStack_11798);
                    fdb_shutdown();
                    memleak_end();
                    pcVar7 = "%s PASSED\n";
                    if (set_get_meta_test()::__test_pass != '\0') {
                      pcVar7 = "%s FAILED\n";
                    }
                    fprintf(_stderr,pcVar7,"set get meta test");
                    return;
                  }
                }
                else {
                  set_get_meta_test();
                }
                __assert_fail("rdoc->deleted == true",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                              ,0x35c,"void set_get_meta_test()");
              }
            }
            else {
              set_get_meta_test();
            }
            __assert_fail("rdoc->deleted == true",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0x358,"void set_get_meta_test()");
          }
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0x353,"void set_get_meta_test()");
        }
      }
      else {
        set_get_meta_test();
      }
      __assert_fail("status == FDB_RESULT_KEY_NOT_FOUND",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x34f,"void set_get_meta_test()");
    }
  }
  else {
    set_get_meta_test();
  }
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x349,"void set_get_meta_test()");
}

Assistant:

void set_get_max_keylen()
{
    TEST_INIT();
    memleak_start();

    int r;
    static const int len = FDB_MAX_KEYLEN;
    char keybuf[len];
    void *rvalue;
    size_t rvalue_len;
    static const char *achar = "a";

    fdb_status status;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_config fconfig = fdb_get_default_config();
    fconfig.chunksize = 16;


    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    for (int i = 0; i < len; ++i) {
        keybuf[i] = *achar;
    }
    keybuf[len-1] = '\0';

    // open db
    status = fdb_open(&dbfile, "./dummy1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // set kv
    status = fdb_set_kv(db, keybuf, strlen(keybuf), NULL, 0);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // get NULL pointer
    status = fdb_get(db, NULL);
    TEST_CHK(status == FDB_RESULT_INVALID_ARGS);

    // get kv
    status = fdb_get_kv(db, keybuf, strlen(keybuf), &rvalue, &rvalue_len);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_close(dbfile);
    fdb_shutdown();

    memleak_end();
    TEST_RESULT("set get max keylen");
}